

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feat.c
# Opt level: O2

void feat_s3_1x39_cep2feat(feat_t *fcb,mfcc_t **mfc,mfcc_t **feat)

{
  mfcc_t *pmVar1;
  mfcc_t *pmVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  
  if (fcb == (feat_t *)0x0) {
    __assert_fail("fcb",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                  ,0x1f0,"void feat_s3_1x39_cep2feat(feat_t *, mfcc_t **, mfcc_t **)");
  }
  if (fcb->cepsize != 0xd) {
    __assert_fail("feat_cepsize(fcb) == 13",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                  ,0x1f1,"void feat_s3_1x39_cep2feat(feat_t *, mfcc_t **, mfcc_t **)");
  }
  if (fcb->n_stream != 1) {
    __assert_fail("feat_n_stream(fcb) == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                  ,0x1f2,"void feat_s3_1x39_cep2feat(feat_t *, mfcc_t **, mfcc_t **)");
  }
  if (*fcb->stream_len == 0x27) {
    if (fcb->window_size == 3) {
      pmVar1 = *feat;
      pmVar2 = *mfc;
      uVar7 = *(undefined8 *)(pmVar2 + 1);
      uVar8 = *(undefined8 *)(pmVar2 + 3);
      uVar9 = *(undefined8 *)(pmVar2 + 5);
      uVar10 = *(undefined8 *)(pmVar2 + 7);
      uVar11 = *(undefined8 *)(pmVar2 + 0xb);
      *(undefined8 *)(pmVar1 + 8) = *(undefined8 *)(pmVar2 + 9);
      *(undefined8 *)(pmVar1 + 10) = uVar11;
      *(undefined8 *)(pmVar1 + 4) = uVar9;
      *(undefined8 *)(pmVar1 + 6) = uVar10;
      *(undefined8 *)pmVar1 = uVar7;
      *(undefined8 *)(pmVar1 + 2) = uVar8;
      pmVar1 = *feat;
      lVar13 = (long)fcb->cepsize;
      pfVar3 = (float *)mfc[-2];
      pfVar4 = (float *)mfc[2];
      uVar14 = 0;
      uVar12 = 0;
      if (0 < (int)(lVar13 - 1U)) {
        uVar12 = lVar13 - 1U & 0xffffffff;
      }
      for (; uVar12 != uVar14; uVar14 = uVar14 + 1) {
        pmVar1[lVar13 + (uVar14 - 1)] = (mfcc_t)(pfVar4[uVar14 + 1] - pfVar3[uVar14 + 1]);
      }
      pmVar1 = pmVar1 + lVar13 * 2 + -2;
      *pmVar1 = **mfc;
      pmVar1[1] = (mfcc_t)(*pfVar4 - *pfVar3);
      pfVar3 = (float *)mfc[3];
      pfVar4 = (float *)mfc[-3];
      pfVar5 = (float *)mfc[-1];
      pfVar6 = (float *)mfc[1];
      pmVar1[2] = (mfcc_t)((*pfVar3 - *pfVar5) - (*pfVar6 - *pfVar4));
      for (uVar14 = 0; uVar12 != uVar14; uVar14 = uVar14 + 1) {
        pmVar1[uVar14 + 3] =
             (mfcc_t)((pfVar3[uVar14 + 1] - pfVar5[uVar14 + 1]) -
                     (pfVar6[uVar14 + 1] - pfVar4[uVar14 + 1]));
      }
      return;
    }
    __assert_fail("feat_window_size(fcb) == 3",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                  ,500,"void feat_s3_1x39_cep2feat(feat_t *, mfcc_t **, mfcc_t **)");
  }
  __assert_fail("feat_stream_len(fcb, 0) == 39",
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                ,499,"void feat_s3_1x39_cep2feat(feat_t *, mfcc_t **, mfcc_t **)");
}

Assistant:

static void
feat_s3_1x39_cep2feat(feat_t * fcb, mfcc_t ** mfc, mfcc_t ** feat)
{
    mfcc_t *f;
    mfcc_t *w, *_w;
    mfcc_t *w1, *w_1, *_w1, *_w_1;
    mfcc_t d1, d2;
    int32 i;

    assert(fcb);
    assert(feat_cepsize(fcb) == 13);
    assert(feat_n_stream(fcb) == 1);
    assert(feat_stream_len(fcb, 0) == 39);
    assert(feat_window_size(fcb) == 3);

    /* CEP; skip C0 */
    memcpy(feat[0], mfc[0] + 1, (feat_cepsize(fcb) - 1) * sizeof(mfcc_t));
    /*
     * DCEP: mfc[2] - mfc[-2];
     */
    f = feat[0] + feat_cepsize(fcb) - 1;
    w = mfc[2] + 1;             /* +1 to skip C0 */
    _w = mfc[-2] + 1;

    for (i = 0; i < feat_cepsize(fcb) - 1; i++)
        f[i] = w[i] - _w[i];

    /* POW: C0, DC0, D2C0 */
    f += feat_cepsize(fcb) - 1;

    f[0] = mfc[0][0];
    f[1] = mfc[2][0] - mfc[-2][0];

    d1 = mfc[3][0] - mfc[-1][0];
    d2 = mfc[1][0] - mfc[-3][0];
    f[2] = d1 - d2;

    /* D2CEP: (mfc[3] - mfc[-1]) - (mfc[1] - mfc[-3]) */
    f += 3;

    w1 = mfc[3] + 1;            /* Final +1 to skip C0 */
    _w1 = mfc[-1] + 1;
    w_1 = mfc[1] + 1;
    _w_1 = mfc[-3] + 1;

    for (i = 0; i < feat_cepsize(fcb) - 1; i++) {
        d1 = w1[i] - _w1[i];
        d2 = w_1[i] - _w_1[i];

        f[i] = d1 - d2;
    }
}